

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O2

void __thiscall
FIX::SocketMonitor::buildSet(SocketMonitor *this,Sockets *sockets,pollfd *pfds,short events)

{
  _Rb_tree_node_base *p_Var1;
  ulong uVar2;
  
  uVar2 = 0;
  for (p_Var1 = (sockets->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(sockets->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    pfds[uVar2].fd = p_Var1[1]._M_color;
    pfds[uVar2].events = events;
    pfds[uVar2].revents = 0;
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  return;
}

Assistant:

void SocketMonitor::buildSet(const Sockets &sockets, struct pollfd *pfds, short events) {
  Sockets::const_iterator iter;
  unsigned int i = 0;
  for (iter = sockets.begin(); iter != sockets.end(); ++iter) {
    pfds[i].fd = *iter;
    pfds[i].events = events;
    pfds[i].revents = 0;
    i += 1;
  }
}